

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall t_cpp_generator::init_generator(t_cpp_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  t_program *ptVar2;
  pointer pptVar3;
  pointer pbVar4;
  int iVar5;
  int *piVar6;
  long *plVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  long *plVar10;
  size_type *psVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cpp_include;
  pointer pbVar12;
  t_cpp_generator *ptVar13;
  pointer pptVar14;
  string f_types_tcc_name;
  string f_types_name;
  string f_types_impl_name;
  string local_188;
  t_cpp_generator *local_168;
  ofstream_with_content_based_conditional_update *local_160;
  string local_158;
  ofstream_with_content_based_conditional_update *local_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_158,this);
  iVar5 = mkdir(local_158._M_dataplus._M_p,0x1ff);
  paVar1 = &local_158.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((iVar5 == -1) && (piVar6 = __errno_location(), *piVar6 != 0x11)) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_188,this);
    std::__cxx11::string::string
              ((string *)&local_130,local_188._M_dataplus._M_p,(allocator *)&local_110);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_130);
    local_158._M_dataplus._M_p = (pointer)*plVar7;
    psVar11 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_158._M_dataplus._M_p == psVar11) {
      local_158.field_2._M_allocated_capacity = *psVar11;
      local_158.field_2._8_8_ = plVar7[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar11;
    }
    local_158._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    __rhs = strerror(*piVar6);
    std::operator+(__return_storage_ptr__,&local_158,__rhs);
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  ptVar13 = (t_cpp_generator *)
            (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,ptVar13,
             (long)&(ptVar13->super_t_oop_generator).super_t_generator._vptr_t_generator +
             (this->super_t_oop_generator).super_t_generator.program_name_._M_string_length);
  get_legal_program_name(&local_158,ptVar13,&local_50);
  std::__cxx11::string::operator=
            ((string *)&(this->super_t_oop_generator).super_t_generator.program_name_,
             (string *)&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_188,this);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_188,
                              (ulong)(this->super_t_oop_generator).super_t_generator.program_name_.
                                     _M_dataplus._M_p);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_120 = *plVar10;
    lStack_118 = plVar7[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar10;
    local_130 = (long *)*plVar7;
  }
  local_128 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_130);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_158.field_2._M_allocated_capacity = *psVar11;
    local_158.field_2._8_8_ = plVar7[3];
    local_158._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar11;
    local_158._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_158._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_types_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  this_00 = &this->f_types_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (this_00);
  (this->f_types_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90
       = 0;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_110,this);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_110,
                              (ulong)(this->super_t_oop_generator).super_t_generator.program_name_.
                                     _M_dataplus._M_p);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_188.field_2._M_allocated_capacity = *psVar11;
    local_188.field_2._8_8_ = plVar7[3];
  }
  else {
    local_188.field_2._M_allocated_capacity = *psVar11;
    local_188._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_188._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_120 = *plVar10;
    lStack_118 = plVar7[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar10;
    local_130 = (long *)*plVar7;
  }
  local_128 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  paVar1 = &local_188.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  std::__cxx11::string::string((string *)&local_188,(char *)local_130,(allocator *)&local_110);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_types_impl_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  local_160 = &this->f_types_impl_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (local_160);
  (this->f_types_impl_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
  field_0x90 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if (this->gen_templates_ == true) {
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_b0,this);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_b0,
                                (ulong)(this->super_t_oop_generator).super_t_generator.program_name_
                                       ._M_dataplus._M_p);
    plVar10 = plVar7 + 2;
    if ((long *)*plVar7 == plVar10) {
      local_100 = *plVar10;
      lStack_f8 = plVar7[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar10;
      local_110 = (long *)*plVar7;
    }
    local_108 = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
    psVar11 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_188.field_2._M_allocated_capacity = *psVar11;
      local_188.field_2._8_8_ = puVar8[3];
      local_188._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_188.field_2._M_allocated_capacity = *psVar11;
      local_188._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_188._M_string_length = puVar8[1];
    *puVar8 = psVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
    std::__cxx11::string::string
              ((string *)&local_110,local_188._M_dataplus._M_p,(allocator *)local_b0);
    std::__cxx11::string::_M_assign
              ((string *)
               &(this->f_types_tcc_).super_ostringstream.
                super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    clear_buf(&this->f_types_tcc_);
    (this->f_types_tcc_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
    field_0x90 = 0;
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar1) {
      operator_delete(local_188._M_dataplus._M_p);
    }
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_188,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_188._M_dataplus._M_p,local_188._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_188,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160,local_188._M_dataplus._M_p,local_188._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_188,this);
  local_138 = &this->f_types_tcc_;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_138,local_188._M_dataplus._M_p,local_188._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#ifndef ",8);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,
                      (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus._M_p
                      ,(this->super_t_oop_generator).super_t_generator.program_name_.
                       _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_TYPES_H",8);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"#define ",8);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(this->super_t_oop_generator).super_t_generator.program_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.program_name_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_TYPES_H",8);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_138,"#ifndef ",8);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_138,
                      (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus._M_p
                      ,(this->super_t_oop_generator).super_t_generator.program_name_.
                       _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_TYPES_TCC",10);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"#define ",8);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(this->super_t_oop_generator).super_t_generator.program_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.program_name_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_TYPES_TCC",10);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#include <iosfwd>",0x11);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"#include <thrift/Thrift.h>",0x1a);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"#include <thrift/TApplicationException.h>",0x29);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"#include <thrift/TBase.h>",0x19);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"#include <thrift/protocol/TProtocol.h>",0x26);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"#include <thrift/transport/TTransport.h>",0x28);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#include <functional>",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#include <memory>",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  ptVar2 = (this->super_t_oop_generator).super_t_generator.program_;
  pptVar14 = (ptVar2->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pptVar3 = (ptVar2->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_168 = this;
  if (pptVar14 != pptVar3) {
    do {
      ptVar2 = *pptVar14;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#include \"",10);
      get_include_prefix_abi_cxx11_(&local_188,local_168,ptVar2);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this_00,local_188._M_dataplus._M_p,local_188._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(ptVar2->name_)._M_dataplus._M_p,(ptVar2->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_types.h\"",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_138,"#include \"",10);
      get_include_prefix_abi_cxx11_(&local_188,local_168,ptVar2);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_138,local_188._M_dataplus._M_p,local_188._M_string_length
                         );
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(ptVar2->name_)._M_dataplus._M_p,(ptVar2->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_types.tcc\"",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      pptVar14 = pptVar14 + 1;
    } while (pptVar14 != pptVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  ptVar2 = (local_168->super_t_oop_generator).super_t_generator.program_;
  pbVar4 = (ptVar2->cpp_includes_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar12 = (ptVar2->cpp_includes_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar4; pbVar12 = pbVar12 + 1
      ) {
    if (*(pbVar12->_M_dataplus)._M_p == '<') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#include ",9);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this_00,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#include \"",10);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this_00,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_160,"#include \"",10);
  get_include_prefix_abi_cxx11_
            (&local_188,local_168,(local_168->super_t_oop_generator).super_t_generator.program_);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_160,local_188._M_dataplus._M_p,local_188._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(local_168->super_t_oop_generator).super_t_generator.program_name_.
                             _M_dataplus._M_p,
                      (local_168->super_t_oop_generator).super_t_generator.program_name_.
                      _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_types.h\"",9);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_138,"#include \"",10);
  get_include_prefix_abi_cxx11_
            (&local_188,local_168,(local_168->super_t_oop_generator).super_t_generator.program_);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_138,local_188._M_dataplus._M_p,local_188._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(local_168->super_t_oop_generator).super_t_generator.program_name_.
                             _M_dataplus._M_p,
                      (local_168->super_t_oop_generator).super_t_generator.program_name_.
                      _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_types.h\"",9);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160,"#include <algorithm>",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_160,"#include <ostream>",0x12)
  ;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_160,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160,"#include <thrift/TToString.h>",0x1d);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_160,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar13 = (t_cpp_generator *)(local_168->super_t_oop_generator).super_t_generator.program_;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"cpp","");
  t_program::get_namespace(&local_70,(t_program *)ptVar13,&local_d0);
  namespace_open(&local_188,ptVar13,&local_70);
  std::__cxx11::string::operator=((string *)&local_168->ns_open_,(string *)&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  ptVar13 = (t_cpp_generator *)(local_168->super_t_oop_generator).super_t_generator.program_;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"cpp","");
  t_program::get_namespace(&local_90,(t_program *)ptVar13,&local_f0);
  namespace_close(&local_188,ptVar13,&local_90);
  std::__cxx11::string::operator=((string *)&local_168->ns_close_,(string *)&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,(local_168->ns_open_)._M_dataplus._M_p,
                      (local_168->ns_open_)._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_160,(local_168->ns_open_)._M_dataplus._M_p,
                      (local_168->ns_open_)._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_138,(local_168->ns_open_)._M_dataplus._M_p,
                      (local_168->ns_open_)._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_cpp_generator::init_generator() {
  // Make output directory
  MKDIR(get_out_dir().c_str());

  program_name_ = get_legal_program_name(program_name_);

  // Make output file
  string f_types_name = get_out_dir() + program_name_ + "_types.h";
  f_types_.open(f_types_name);

  string f_types_impl_name = get_out_dir() + program_name_ + "_types.cpp";
  f_types_impl_.open(f_types_impl_name.c_str());

  if (gen_templates_) {
    // If we don't open the stream, it appears to just discard data,
    // which is fine.
    string f_types_tcc_name = get_out_dir() + program_name_ + "_types.tcc";
    f_types_tcc_.open(f_types_tcc_name.c_str());
  }

  // Print header
  f_types_ << autogen_comment();
  f_types_impl_ << autogen_comment();
  f_types_tcc_ << autogen_comment();

  // Start ifndef
  f_types_ << "#ifndef " << program_name_ << "_TYPES_H" << endl << "#define " << program_name_
           << "_TYPES_H" << endl << endl;
  f_types_tcc_ << "#ifndef " << program_name_ << "_TYPES_TCC" << endl << "#define " << program_name_
               << "_TYPES_TCC" << endl << endl;

  // Include base types
  f_types_ << "#include <iosfwd>" << endl
           << endl
           << "#include <thrift/Thrift.h>" << endl
           << "#include <thrift/TApplicationException.h>" << endl
           << "#include <thrift/TBase.h>" << endl
           << "#include <thrift/protocol/TProtocol.h>" << endl
           << "#include <thrift/transport/TTransport.h>" << endl
           << endl;
  // Include C++xx compatibility header
  f_types_ << "#include <functional>" << endl;
  f_types_ << "#include <memory>" << endl;

  // Include other Thrift includes
  const vector<t_program*>& includes = program_->get_includes();
  for (auto include : includes) {
    f_types_ << "#include \"" << get_include_prefix(*include) << include->get_name()
             << "_types.h\"" << endl;

    // XXX(simpkins): If gen_templates_ is enabled, we currently assume all
    // included files were also generated with templates enabled.
    f_types_tcc_ << "#include \"" << get_include_prefix(*include) << include->get_name()
                 << "_types.tcc\"" << endl;
  }
  f_types_ << endl;

  // Include custom headers
  const vector<string>& cpp_includes = program_->get_cpp_includes();
  for (const auto & cpp_include : cpp_includes) {
    if (cpp_include[0] == '<') {
      f_types_ << "#include " << cpp_include << endl;
    } else {
      f_types_ << "#include \"" << cpp_include << "\"" << endl;
    }
  }
  f_types_ << endl;

  // Include the types file
  f_types_impl_ << "#include \"" << get_include_prefix(*get_program()) << program_name_
                << "_types.h\"" << endl << endl;
  f_types_tcc_ << "#include \"" << get_include_prefix(*get_program()) << program_name_
               << "_types.h\"" << endl << endl;

  // The swap() code needs <algorithm> for std::swap()
  f_types_impl_ << "#include <algorithm>" << endl;
  // for operator<<
  f_types_impl_ << "#include <ostream>" << endl << endl;
  f_types_impl_ << "#include <thrift/TToString.h>" << endl << endl;

  // Open namespace
  ns_open_ = namespace_open(program_->get_namespace("cpp"));
  ns_close_ = namespace_close(program_->get_namespace("cpp"));

  f_types_ << ns_open_ << endl << endl;

  f_types_impl_ << ns_open_ << endl << endl;

  f_types_tcc_ << ns_open_ << endl << endl;
}